

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImU32 IVar5;
  float fVar6;
  float fVar7;
  bool held;
  bool hovered;
  ImVec2 center;
  ImRect bb;
  bool local_62;
  bool local_61;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [16];
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  fVar6 = (GImGui->Style).FramePadding.x;
  fVar7 = (GImGui->Style).FramePadding.y;
  local_58.Max.x = fVar6 + fVar6 + pos->x + GImGui->FontSize;
  local_58.Max.y = fVar7 + fVar7 + GImGui->FontSize + pos->y;
  local_58.Min = *pos;
  bVar3 = ItemAdd(&local_58,id,(ImRect *)0x0);
  bVar4 = ButtonBehavior(&local_58,id,&local_61,&local_62,0);
  if (bVar3) {
    IVar5 = GetColorU32(local_62 | 0x16,1.0);
    local_60.x = (local_58.Min.x + local_58.Max.x) * 0.5;
    local_60.y = (local_58.Min.y + local_58.Max.y) * 0.5;
    if (local_61 == true) {
      fVar7 = pIVar2->FontSize * 0.5 + 1.0;
      fVar6 = 2.0;
      if (2.0 <= fVar7) {
        fVar6 = fVar7;
      }
      ImDrawList::AddCircleFilled(pIVar1->DrawList,&local_60,fVar6,IVar5,0xc);
    }
    local_38 = ZEXT416((uint)(pIVar2->FontSize * 0.5 * 0.7071 + -1.0));
    IVar5 = GetColorU32(0,1.0);
    local_60.x = local_60.x + -0.5;
    local_60.y = local_60.y + -0.5;
    local_40.y = (float)local_38._0_4_ + local_60.y;
    local_40.x = (float)local_38._0_4_ + local_60.x;
    local_48.y = local_60.y - (float)local_38._0_4_;
    local_48.x = local_60.x - (float)local_38._0_4_;
    ImDrawList::AddLine(pIVar1->DrawList,&local_40,&local_48,IVar5,1.0);
    local_40.y = local_60.y - (float)local_38._0_4_;
    local_40.x = (float)local_38._0_4_ + local_60.x;
    local_48.y = (float)local_38._0_4_ + local_60.y;
    local_48.x = local_60.x - (float)local_38._0_4_;
    ImDrawList::AddLine(pIVar1->DrawList,&local_40,&local_48,IVar5,1.0);
  }
  return bVar4;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)//, float size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}